

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int scalarorder;
  TPZManVector<int,_27> scalarOrders;
  TPZManVector<int,_27> local_c0;
  
  TPZManVector<long,_8>::TPZManVector((TPZManVector<long,_8> *)&scalarOrders,ids);
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<int,_20>::TPZManVector((TPZManVector<int,_20> *)&scalarOrders,sideorient);
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)&scalarOrders);
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)&scalarOrders);
  scalarorder = connectorders->fStore[3] + 1;
  TPZManVector<int,_27>::TPZManVector(&scalarOrders,4,&scalarorder);
  TPZShapeH1<pzshape::TPZShapeTriang>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&scalarOrders.super_TPZVec<int>,data);
  if (connectorders->fNElements != 4) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x26);
  }
  TPZManVector<int,_27>::TPZManVector(&local_c0,connectorders);
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
  TPZManVector<int,_27>::~TPZManVector(&local_c0);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,4);
  piVar1 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
  piVar2 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    iVar5 = piVar1[lVar3] + 1;
    iVar6 = iVar5 * iVar5 + -1;
    if (lVar3 != 3) {
      iVar6 = iVar5;
    }
    piVar2[lVar3] = iVar6;
    iVar4 = iVar4 + iVar6;
  }
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar4);
  ComputeMasterDirections(data);
  ComputeVecandShape(data);
  iVar4 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
  uVar7 = iVar4 - 1;
  uVar9 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar9;
  }
  while( true ) {
    if (uVar8 == uVar9) {
      TPZManVector<int,_27>::~TPZManVector(&scalarOrders);
      return;
    }
    if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar4 + -1] <
        (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar9]) break;
    uVar9 = uVar9 + 1;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x3e);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}